

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O1

Read<signed_char>
Omega_h::inertia::mark_bisection_given_axis
          (CommPtr *comm,Reals *coords,Reals *masses,Real tolerance,Vector<3> axis)

{
  int *piVar1;
  Alloc *pAVar2;
  ulong *puVar3;
  Real total_mass;
  Vector<3> center_00;
  ulong uVar4;
  ulong *in_RCX;
  ulong uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Read<signed_char> RVar7;
  Vector<3> center;
  Reals local_c8;
  Reals local_b8;
  Alloc *local_a8;
  ulong local_a0;
  Reals local_98;
  Reals local_88;
  CommPtr local_78;
  Reals local_68;
  CommPtr local_58;
  Real local_48;
  Vector<3> local_40;
  void *pvVar6;
  
  pAVar2 = (masses->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  puVar3 = (ulong *)*in_RCX;
  if (((ulong)puVar3 & 1) == 0) {
    uVar5 = *puVar3;
  }
  else {
    uVar5 = (ulong)puVar3 >> 3;
  }
  if ((int)(uVar5 >> 3) * 3 == (int)(uVar4 >> 3)) {
    local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(coords->write_).shared_alloc_.alloc;
    local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(coords->write_).shared_alloc_.direct_ptr;
    if (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
    local_48 = tolerance;
    total_mass = repro_sum(&local_58,&local_68);
    pAVar2 = local_68.write_.shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    if (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(coords->write_).shared_alloc_.alloc;
    local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(coords->write_).shared_alloc_.direct_ptr;
    if (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_b8.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.write_.shared_alloc_.alloc =
             (Alloc *)((local_b8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.write_.shared_alloc_.alloc)->use_count =
             (local_b8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
    local_88.write_.shared_alloc_.alloc = (Alloc *)*in_RCX;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.write_.shared_alloc_.alloc)->use_count =
             (local_88.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.write_.shared_alloc_.direct_ptr = (void *)in_RCX[1];
    anon_unknown_0::get_center(&local_40,&local_78,&local_b8,&local_88,total_mass);
    pAVar2 = local_88.write_.shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_b8.write_.shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    if (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_98.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
    local_98.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.write_.shared_alloc_.direct_ptr)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_98.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.write_.shared_alloc_.direct_ptr)->
        _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_98.write_.shared_alloc_.direct_ptr)->_M_use_count + 1;
      }
    }
    local_c8.write_.shared_alloc_.alloc = (masses->write_).shared_alloc_.alloc;
    if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c8.write_.shared_alloc_.alloc =
             (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_c8.write_.shared_alloc_.alloc)->use_count =
             (local_c8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_c8.write_.shared_alloc_.direct_ptr = (masses->write_).shared_alloc_.direct_ptr;
    local_a8 = (Alloc *)*in_RCX;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8 = (Alloc *)(local_a8->size * 8 + 1);
      }
      else {
        local_a8->use_count = local_a8->use_count + 1;
      }
    }
    local_a0 = in_RCX[1];
    center_00.super_Few<double,_3>.array_[1] = local_40.super_Few<double,_3>.array_[1];
    center_00.super_Few<double,_3>.array_[0] = local_40.super_Few<double,_3>.array_[0];
    center_00.super_Few<double,_3>.array_[2] = local_40.super_Few<double,_3>.array_[2];
    RVar7 = anon_unknown_0::mark_bisection_internal
                      (comm,&local_98,&local_c8,local_48,axis,center_00,total_mass);
    pAVar2 = local_a8;
    pvVar6 = RVar7.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      piVar1 = &local_a8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX;
      }
    }
    pAVar2 = local_c8.write_.shared_alloc_.alloc;
    if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.write_.shared_alloc_.direct_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_98.write_.shared_alloc_.direct_ptr);
      pvVar6 = extraout_RDX_01;
    }
    RVar7.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar7.write_.shared_alloc_.alloc = (Alloc *)comm;
    return (Read<signed_char>)RVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","coords.size() == masses.size() * 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x9b);
}

Assistant:

Read<I8> mark_bisection_given_axis(
    CommPtr comm, Reals coords, Reals masses, Real tolerance, Vector<3> axis) {
  OMEGA_H_CHECK(coords.size() == masses.size() * 3);
  auto total_mass = repro_sum(comm, masses);
  auto center = get_center(comm, coords, masses, total_mass);
  return mark_bisection_internal(
      comm, coords, masses, tolerance, axis, center, total_mass);
}